

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

int nn_node_check_prefix(nn_trie_node *self,uint8_t *data,size_t size)

{
  ulong uVar1;
  
  uVar1 = 0;
  while( true ) {
    if (self->prefix_len == uVar1) {
      return (uint)self->prefix_len;
    }
    if (size == uVar1) break;
    if (self->prefix[uVar1] != data[uVar1]) {
      return (int)uVar1;
    }
    uVar1 = uVar1 + 1;
  }
  return (int)size;
}

Assistant:

int nn_node_check_prefix (struct nn_trie_node *self,
    const uint8_t *data, size_t size)
{
    /*  Check how many characters from the data match the prefix. */

    int i;

    for (i = 0; i != self->prefix_len; ++i) {
        if (!size || self->prefix [i] != *data)
            return i;
        ++data;
        --size;
    }
    return self->prefix_len;
}